

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O3

uint Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
               (SmallHeapBlockBitVector *markBits,uint bucketIndex,uint pageStartBitIndex)

{
  uint *puVar1;
  undefined4 *puVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Type TVar9;
  bool bVar10;
  BVIndex BVar11;
  BVStatic<256UL> *this;
  long lVar12;
  undefined8 *in_FS_OFFSET;
  undefined8 uStack_48;
  SmallHeapBlockBitVector temp;
  
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  uStack_48 = 0;
  temp.data[0].word = 0;
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                        ,0x186,"(index < TBlockAttributes::BucketCount)",
                        "index < TBlockAttributes::BucketCount");
    if (!bVar10) goto LAB_0029dd38;
    *puVar2 = 0;
  }
  js_memcpy_s(&uStack_48,0x20,markBits,0x20);
  lVar12 = 0;
  do {
    puVar1 = (uint *)((ulong)bucketIndex * 0x20 + 0x3968b8 + lVar12 * 8);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    uVar7 = *(uint *)((long)&temp.data[lVar12 + -1].word + 4);
    TVar9 = temp.data[lVar12].word;
    uVar8 = *(uint *)((long)&temp.data[lVar12].word + 4);
    *(uint *)&temp.data[lVar12 + -1].word = ~*puVar1 & (uint)temp.data[lVar12 + -1].word;
    *(uint *)((long)&temp.data[lVar12 + -1].word + 4) = ~uVar4 & uVar7;
    *(uint *)&temp.data[lVar12].word = ~uVar5 & (uint)TVar9;
    *(uint *)((long)&temp.data[lVar12].word + 4) = ~uVar6 & uVar8;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 4);
  if ((char)pageStartBitIndex != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                        ,0xa4,"(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0)",
                        "pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0");
    if (!bVar10) {
LAB_0029dd38:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  this = BVStatic<256ul>::GetRange<256ul>((BVStatic<256ul> *)&uStack_48,pageStartBitIndex);
  BVar11 = BVStatic<256UL>::Count(this);
  return BVar11;
}

Assistant:

uint
SmallNormalHeapBlockT<TBlockAttributes>::CalculateMarkCountForPage(SmallHeapBlockBitVector * markBits, uint bucketIndex, uint pageStartBitIndex)
{
    SmallHeapBlockBitVector temp;
    SmallHeapBlockBitVector const* invalid = HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex);

    // Remove any invalid bits from the calculation
    temp.Copy(markBits);
    temp.Minus(invalid);

    Assert(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0);
    uint rescanMarkCount = temp.template GetRange<HeapBlockMap32::PageMarkBitCount>(pageStartBitIndex)->Count();

    // If the first object on the page is not at the start of the page, then the object containing
    // the first few bytes of the page is not included in this mark count
    // The caller will have to account for this
    return rescanMarkCount;
}